

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

int __thiscall
Js::
FreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
::GetFreeItemIndex(FreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
                   *this,List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
                         *list)

{
  uint uVar1;
  WriteBarrierPtr *this_00;
  RecyclerWeakReference<Js::ScriptFunctionType> **ppRVar2;
  uint nextFreeIndex;
  int currentFreeIndex;
  List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *list_local;
  FreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
  *this_local;
  
  this_local._4_4_ = this->freeItemIndex;
  if (this_local._4_4_ == -1) {
    this_local._4_4_ = -1;
  }
  else {
    this_00 = (WriteBarrierPtr *)
              JsUtil::
              List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
              ::Item(list,this_local._4_4_);
    ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__(this_00);
    uVar1 = ::Math::PointerCastToIntegralTruncate<unsigned_int>(*ppRVar2);
    if (uVar1 == 0xffffffff) {
      this->freeItemIndex = -1;
    }
    else {
      this->freeItemIndex = uVar1 >> 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int GetFreeItemIndex(TListType* list)
        {
            int currentFreeIndex = this->freeItemIndex;
            if (currentFreeIndex != -1)
            {
                unsigned int nextFreeIndex = ::Math::PointerCastToIntegralTruncate<unsigned int>(list->Item(currentFreeIndex));

                if (nextFreeIndex != ((unsigned int) -1))
                {
                    // Since this is an unsigned shift, the sign bit is 0, which is what we want
                    this->freeItemIndex = (int) ((nextFreeIndex) >> 1);
                }
                else
                {
                    this->freeItemIndex = -1;
                }

                return currentFreeIndex;
            }

            return -1;
        }